

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void invokeProfileCallback(sqlite3 *db,Vdbe *p)

{
  sqlite3_int64 iElapse;
  sqlite3_int64 iNow;
  u64 local_28;
  long local_20;
  
  sqlite3OsCurrentTimeInt64(db->pVfs,&local_20);
  local_28 = (local_20 - p->startTime) * 1000000;
  if (db->xProfile != (_func_void_void_ptr_char_ptr_u64 *)0x0) {
    (*db->xProfile)(db->pProfileArg,p->zSql,local_28);
  }
  if ((db->mTrace & 2) != 0) {
    (*db->xTrace)(2,db->pTraceArg,p,&local_28);
  }
  p->startTime = 0;
  return;
}

Assistant:

static SQLITE_NOINLINE void invokeProfileCallback(sqlite3 *db, Vdbe *p){
  sqlite3_int64 iNow;
  sqlite3_int64 iElapse;
  assert( p->startTime>0 );
  assert( (db->mTrace & (SQLITE_TRACE_PROFILE|SQLITE_TRACE_XPROFILE))!=0 );
  assert( db->init.busy==0 );
  assert( p->zSql!=0 );
  sqlite3OsCurrentTimeInt64(db->pVfs, &iNow);
  iElapse = (iNow - p->startTime)*1000000;
#ifndef SQLITE_OMIT_DEPRECATED
  if( db->xProfile ){
    db->xProfile(db->pProfileArg, p->zSql, iElapse);
  }
#endif
  if( db->mTrace & SQLITE_TRACE_PROFILE ){
    db->xTrace(SQLITE_TRACE_PROFILE, db->pTraceArg, p, (void*)&iElapse);
  }
  p->startTime = 0;
}